

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegStreamReader.cpp
# Opt level: O1

int __thiscall MPEGStreamReader::bufFromNAL(MPEGStreamReader *this)

{
  uint8_t *puVar1;
  int iVar2;
  
  puVar1 = (this->super_AbstractStreamReader).m_curPos;
  iVar2 = 0;
  if (((long)((ulong)this->m_longCodesAllowed + 3) <=
       (long)(this->super_AbstractStreamReader).m_bufEnd - (long)puVar1) &&
     (((*puVar1 != '\0' || (puVar1[1] != '\0')) ||
      (((this->m_longCodesAllowed == false ||
        ((puVar1[2] != '\0' || (iVar2 = 4, puVar1[3] != '\x01')))) &&
       (iVar2 = 3, puVar1[2] != '\x01')))))) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int MPEGStreamReader::bufFromNAL() const
{
    if (m_bufEnd - m_curPos < (3 + (m_longCodesAllowed ? 1 : 0)))
        return 0;
    if (m_curPos[0] == 0 && m_curPos[1] == 0)
    {
        if (m_longCodesAllowed && m_curPos[2] == 0 && m_curPos[3] == 1)
            return 4;
        if (m_curPos[2] == 1)
            return 3;
    }
    return 0;
}